

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

int covered(double *child_cub,double *points_x,double *points_y,double *points_z,double disk_raduis,
           int hit)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  bool local_51;
  
  local_51 = -1 < hit;
  if (local_51) {
    uVar1 = 0;
    do {
      uVar2 = 0xfffffffffffffffd;
      dVar4 = 0.0;
      do {
        dVar3 = (child_cub[uVar2 + 5] - points_z[uVar1]) * (child_cub[uVar2 + 5] - points_z[uVar1])
                + (child_cub[uVar2 + 3] - points_x[uVar1]) *
                  (child_cub[uVar2 + 3] - points_x[uVar1]) +
                  (child_cub[uVar2 + 4] - points_y[uVar1]) *
                  (child_cub[uVar2 + 4] - points_y[uVar1]);
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        if (dVar3 <= dVar4) {
          dVar3 = dVar4;
        }
        uVar2 = uVar2 + 3;
        dVar4 = dVar3;
      } while (uVar2 < 0x15);
      if (dVar3 < disk_raduis) break;
      local_51 = uVar1 < (uint)hit;
      uVar1 = uVar1 + 1;
    } while (uVar1 != hit + 1);
  }
  return (uint)local_51;
}

Assistant:

int covered(double *child_cub,double *points_x,double *points_y,double *points_z, double disk_raduis,int hit)
{
	double distance;
	double max_distance;
	for (int m = 0; m <= hit; m++)
	{
		max_distance=0.0;
		for (int i = 0; i < 24; i=i+3)
		{
			distance=dist_two_points_3d(points_x[m],points_y[m],points_z[m],child_cub[i],child_cub[i+1],child_cub[i+2]);
			if (distance>max_distance) max_distance=distance;
		}
		if (max_distance < disk_raduis) return(1);
	}
	return(0);
}